

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v8::detail::count_digits<1,unsigned_long>(unsigned_long n)

{
  undefined4 local_14;
  unsigned_long uStack_10;
  int num_digits;
  unsigned_long n_local;
  
  local_14 = 0;
  uStack_10 = n;
  do {
    local_14 = local_14 + 1;
    uStack_10 = uStack_10 >> 1;
  } while (uStack_10 != 0);
  return local_14;
}

Assistant:

FMT_CONSTEXPR auto count_digits(UInt n) -> int {
#ifdef FMT_BUILTIN_CLZ
  if (num_bits<UInt>() == 32)
    return (FMT_BUILTIN_CLZ(static_cast<uint32_t>(n) | 1) ^ 31) / BITS + 1;
#endif
  int num_digits = 0;
  do {
    ++num_digits;
  } while ((n >>= BITS) != 0);
  return num_digits;
}